

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O0

void __thiscall QAccessibleTableCell::setText(QAccessibleTableCell *this,Text param_2,QString *text)

{
  byte bVar1;
  QAbstractItemModel *pQVar2;
  QAbstractItemView *in_RDX;
  QFlags<Qt::ItemFlag> *in_RDI;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff88;
  ItemFlag other;
  bool local_61;
  QPersistentModelIndex local_48 [3];
  undefined4 local_30;
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_2c;
  QVariant local_28;
  long local_8;
  
  other = (ItemFlag)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = (**(code **)(*(long *)in_RDI + 0x10))();
  local_61 = true;
  if ((bVar1 & 1) != 0) {
    local_30 = QPersistentModelIndex::flags();
    local_2c.super_QFlagsStorage<Qt::ItemFlag>.i =
         (QFlagsStorage<Qt::ItemFlag>)QFlags<Qt::ItemFlag>::operator&(in_RDI,other);
    local_61 = QFlags<Qt::ItemFlag>::operator!((QFlags<Qt::ItemFlag> *)&local_2c);
  }
  if (local_61 == false) {
    QPointer<QAbstractItemView>::operator->((QPointer<QAbstractItemView> *)0x7f9e20);
    pQVar2 = QAbstractItemView::model(in_RDX);
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_48);
    ::QVariant::QVariant(&local_28,(QString *)in_RDX);
    (**(code **)(*(long *)pQVar2 + 0x98))(pQVar2,local_48,&local_28,2);
    ::QVariant::~QVariant(&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAccessibleTableCell::setText(QAccessible::Text /*t*/, const QString &text)
{
    if (!isValid() || !(m_index.flags() & Qt::ItemIsEditable))
        return;
    view->model()->setData(m_index, text);
}